

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Meteomatics_Internals.h
# Opt level: O0

bool __thiscall
MeteomaticsApiClient::getMultiPointTimeSeries
          (MeteomaticsApiClient *this,string *startTime,string *stopTime,string *timeStep,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *parameters,vector<double,_std::allocator<double>_> *lats,
          vector<double,_std::allocator<double>_> *lons,
          vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
          *result,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *times,string *msg,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *optionals)

{
  HttpClient *this_00;
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  undefined1 local_2a0 [8];
  Matrix tmpM;
  MemoryClass local_280;
  allocator local_259;
  string local_258 [32];
  undefined1 local_238 [8];
  MemoryClass mem;
  undefined1 local_210 [4];
  int httpReturnCode;
  MeteomaticsApiClient local_1f0 [2];
  MeteomaticsApiClient local_1d0 [3];
  string local_1a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [8];
  string queryString;
  vector<double,_std::allocator<double>_> *lats_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *parameters_local;
  string *timeStep_local;
  string *stopTime_local;
  string *startTime_local;
  MeteomaticsApiClient *this_local;
  
  std::
  vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
  ::clear(result);
  std::__cxx11::string::clear();
  std::operator+((char *)local_1a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"/");
  std::operator+(local_180,(char *)local_1a0);
  std::operator+(local_160,local_180);
  std::operator+(local_140,(char *)local_160);
  std::operator+(local_120,local_140);
  std::operator+(local_100,(char *)local_120);
  createParameterListString(local_1d0,parameters);
  std::operator+(local_e0,local_100);
  std::operator+(local_c0,(char *)local_e0);
  createLatLonListString_abi_cxx11_(local_1f0,lats,lons);
  std::operator+(local_a0,local_c0);
  std::operator+(local_80,(char *)local_a0);
  getOptionalSelectString((MeteomaticsApiClient *)local_210,optionals);
  std::operator+(local_60,local_80);
  std::__cxx11::string::~string((string *)local_210);
  std::__cxx11::string::~string((string *)local_80);
  std::__cxx11::string::~string((string *)local_a0);
  std::__cxx11::string::~string((string *)local_1f0);
  std::__cxx11::string::~string((string *)local_c0);
  std::__cxx11::string::~string((string *)local_e0);
  std::__cxx11::string::~string((string *)local_1d0);
  std::__cxx11::string::~string((string *)local_100);
  std::__cxx11::string::~string((string *)local_120);
  std::__cxx11::string::~string((string *)local_140);
  std::__cxx11::string::~string((string *)local_160);
  std::__cxx11::string::~string((string *)local_180);
  std::__cxx11::string::~string(local_1a0);
  mem.readPos._4_4_ = 0;
  MMIntern::MemoryClass::MemoryClass((MemoryClass *)local_238,500);
  this_00 = this->httpClient;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_258,"api.meteomatics.com",&local_259);
  MMIntern::HttpClient::requestBinary
            (this_00,(string *)local_258,local_60,(MemoryClass *)local_238,this->dataRequestTimeout,
             (int *)((long)&mem.readPos + 4));
  std::__cxx11::string::~string(local_258);
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  bVar1 = MMIntern::http_code_success(mem.readPos._4_4_);
  if (bVar1) {
    sVar3 = std::vector<double,_std::allocator<double>_>::size(lats);
    if (sVar3 == 1) {
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                *)local_2a0);
      bVar1 = readSinglePointTimeSeriesBin
                        (this,(MemoryClass *)local_238,
                         (vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          *)local_2a0,times);
      if (bVar1) {
        std::
        vector<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
        ::push_back(result,(value_type *)local_2a0);
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout,"Error while reading mem-object.");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        this_local._7_1_ = 0;
      }
      tmpM.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._5_3_ = 0;
      tmpM.
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = !bVar1;
      std::
      vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ::~vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *)local_2a0);
      if (tmpM.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ != 0) goto LAB_00115d69;
    }
    else {
      bVar1 = readMultiPointTimeSeriesBin(this,(MemoryClass *)local_238,result,times);
      if (!bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cout,"Error while reading mem-object.");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        this_local._7_1_ = 0;
        tmpM.
        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
        goto LAB_00115d69;
      }
    }
    this_local._7_1_ = 1;
    tmpM.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Http Error! Code: ");
    std::ostream::operator<<(poVar2,mem.readPos._4_4_);
    poVar2 = std::operator<<((ostream *)&std::cout,". For more information see returned msg string!"
                            );
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    MMIntern::MemoryClass::size((MemoryClass *)local_238);
    MMIntern::MemoryClass::readString_abi_cxx11_(&local_280,(size_t)local_238);
    std::__cxx11::string::operator=((string *)msg,(string *)&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    this_local._7_1_ = 0;
    tmpM.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
  }
LAB_00115d69:
  MMIntern::MemoryClass::~MemoryClass((MemoryClass *)local_238);
  std::__cxx11::string::~string((string *)local_60);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool MeteomaticsApiClient::getMultiPointTimeSeries(const std::string& startTime, const std::string& stopTime, const std::string& timeStep, const std::vector<std::string>& parameters, std::vector<double> lats, std::vector<double> lons, std::vector<Matrix>& result, std::vector<std::string>& times, std::string& msg, const std::vector<std::string>& optionals) const
{
    result.clear();
    msg.clear();
    
    std::string queryString = "/" + startTime + "--" + stopTime + ":P" + timeStep
    + "/" + createParameterListString(parameters)
    + "/" + createLatLonListString(lats, lons)
    + "/bin"
    + getOptionalSelectString(optionals);
    
    int httpReturnCode = 0;
    
    MMIntern::MemoryClass mem(500);
    
    httpClient->requestBinary("api.meteomatics.com", queryString, mem, dataRequestTimeout, httpReturnCode);
    
    if (!MMIntern::http_code_success(httpReturnCode))
    {
        std::cout << "Http Error! Code: " << httpReturnCode;
        std::cout << ". For more information see returned msg string!" << std::endl;
        msg = mem.readString(mem.size());
        return false;
    }
    
    if (lats.size() == 1)
    {
        Matrix tmpM;
        if (!readSinglePointTimeSeriesBin(mem, tmpM, times))
        {
            std::cout << "Error while reading mem-object." << std::endl;
            return false;
        }
        result.push_back(tmpM);
    }
    else
    {
        if (!readMultiPointTimeSeriesBin(mem, result, times))
        {
            std::cout << "Error while reading mem-object." << std::endl;
            return false;
        }
    }
    return true;
}